

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O2

void ga_f2c_get_cmd_args(int *argc,char ***argv)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  long local_250;
  int *local_248;
  char ***local_240;
  char cstring [255];
  char fstring [255];
  
  local_248 = argc;
  local_240 = argv;
  iVar1 = f2c_iargc_();
  if (0xff < iVar1) {
    printf("ga_f2c_get_cmd_args: too many cmd line args");
    armci_msg_abort(1);
  }
  ppcVar2 = (char **)malloc(0x7f8);
  if (ppcVar2 == (char **)0x0) {
    printf("ga_f2c_get_cmd_args: malloc iargv failed");
    armci_msg_abort(1);
  }
  for (local_250 = 0; local_250 < iVar1; local_250 = local_250 + 1) {
    f2c_getarg_(&local_250,fstring,0xff);
    ga_f2cstring(fstring,0xff,cstring,0xff);
    pcVar3 = strdup(cstring);
    ppcVar2[local_250] = pcVar3;
  }
  *local_248 = iVar1;
  *local_240 = ppcVar2;
  ppcVar2[iVar1] = (char *)0x0;
  return;
}

Assistant:

void ga_f2c_get_cmd_args(int *argc, char ***argv)
{
    Integer i=0;
    int iargc=F2C_IARGC();
    char **iargv=NULL;

    if (iargc > F2C_GETARG_ARGV_MAX) {
        printf("ga_f2c_get_cmd_args: too many cmd line args");
        armci_msg_abort(1);
    }
    iargv = (char**)malloc(sizeof(char*)*F2C_GETARG_ARGV_MAX);
    if (!iargv) {
        printf("ga_f2c_get_cmd_args: malloc iargv failed");
        armci_msg_abort(1);
    }
    for (i=0; i<iargc; i++) {
        char fstring[F2C_GETARG_ARGLEN_MAX];
        char cstring[F2C_GETARG_ARGLEN_MAX];
        F2C_GETARG(&i, fstring, F2C_GETARG_ARGLEN_MAX);
        ga_f2cstring(fstring, F2C_GETARG_ARGLEN_MAX,
                cstring, F2C_GETARG_ARGLEN_MAX);
        iargv[i] = strdup(cstring);
    }
    *argc = iargc;
    *argv = iargv;
    iargv[iargc] = 0;
}